

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O3

void kj::anon_unknown_0::setNonblocking(int fd)

{
  uint uVar1;
  int iVar2;
  Fault f;
  Fault local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  do {
    uVar1 = fcntl(fd,3);
    if (-1 < (int)uVar1) goto LAB_001e4675;
    iVar2 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    local_30.exception = (Exception *)0x0;
    local_28 = 0;
    uStack_20 = 0;
    kj::_::Debug::Fault::init
              (&local_30,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    kj::_::Debug::Fault::fatal(&local_30);
  }
LAB_001e4675:
  if ((uVar1 >> 0xb & 1) == 0) {
    do {
      iVar2 = fcntl(fd,4,(ulong)(uVar1 | 0x800));
      if (-1 < iVar2) {
        return;
      }
      iVar2 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar2 == -1);
    if (iVar2 != 0) {
      local_30.exception = (Exception *)0x0;
      local_28 = 0;
      uStack_20 = 0;
      kj::_::Debug::Fault::init
                (&local_30,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                );
      kj::_::Debug::Fault::fatal(&local_30);
    }
  }
  return;
}

Assistant:

static void setNonblocking(int fd) {
  int flags;
  KJ_SYSCALL(flags = fcntl(fd, F_GETFL));
  if ((flags & O_NONBLOCK) == 0) {
    KJ_SYSCALL(fcntl(fd, F_SETFL, flags | O_NONBLOCK));
  }
}